

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff_merge_tree(lyd_node **diff_first,lyd_node *diff_parent,lyd_node *src_sibling,
                          lyd_diff_cb diff_cb,void *cb_data,uint16_t options)

{
  ly_ht *local_48;
  ly_ht *dup_inst;
  LY_ERR ret;
  uint16_t options_local;
  void *cb_data_local;
  lyd_diff_cb diff_cb_local;
  lyd_node *src_sibling_local;
  lyd_node *diff_parent_local;
  lyd_node **diff_first_local;
  
  local_48 = (ly_ht *)0x0;
  if (src_sibling == (lyd_node *)0x0) {
    diff_first_local._4_4_ = LY_SUCCESS;
  }
  else {
    dup_inst._6_2_ = options;
    _ret = cb_data;
    cb_data_local = diff_cb;
    diff_cb_local = (lyd_diff_cb)src_sibling;
    src_sibling_local = diff_parent;
    diff_parent_local = (lyd_node *)diff_first;
    dup_inst._0_4_ =
         lyd_diff_merge_r(src_sibling,diff_parent,diff_cb,cb_data,&local_48,options,diff_first);
    lyd_dup_inst_free(local_48);
    diff_first_local._4_4_ = (LY_ERR)dup_inst;
  }
  return diff_first_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_diff_merge_tree(struct lyd_node **diff_first, struct lyd_node *diff_parent, const struct lyd_node *src_sibling,
        lyd_diff_cb diff_cb, void *cb_data, uint16_t options)
{
    LY_ERR ret;
    struct ly_ht *dup_inst = NULL;

    if (!src_sibling) {
        return LY_SUCCESS;
    }

    ret = lyd_diff_merge_r(src_sibling, diff_parent, diff_cb, cb_data, &dup_inst, options, diff_first);
    lyd_dup_inst_free(dup_inst);
    return ret;
}